

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# functionals.c
# Opt level: O2

void xc_available_functional_numbers_by_name(int *list)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar1 = xc_number_of_functionals();
  uVar2 = 0;
  uVar3 = 0;
  if (0 < (int)uVar1) {
    uVar3 = (ulong)uVar1;
  }
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    list[uVar2] = (int)uVar2;
  }
  qsort(list,(long)(int)uVar1,4,compare_func_names);
  for (uVar2 = 0; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    list[uVar2] = xc_functional_keys[list[uVar2]].number;
  }
  return;
}

Assistant:

void xc_available_functional_numbers_by_name(int *list)
{
  int ii, N;

  /* Arrange list of functional IDs by name */
  N=xc_number_of_functionals();
  for(ii=0;ii<N;ii++) {
    list[ii]=ii;
  }
  qsort(list, N, sizeof(int), compare_func_names);
  /* Map the internal list to functional IDs */
  for(ii=0;ii<N;ii++){
    list[ii]=xc_functional_keys[list[ii]].number;
  }
}